

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

R_conflict7 * parse_token(R_conflict7 *__return_storage_ptr__,QByteArrayView data)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  storage_type *psVar4;
  long lVar5;
  long lVar6;
  
  psVar4 = data.m_data;
  lVar5 = data.m_size;
  lVar6 = 0;
  lVar2 = 0;
  if (0 < lVar5) {
    lVar2 = lVar5;
  }
  for (; lVar3 = lVar2, lVar2 != lVar6; lVar6 = lVar6 + 1) {
    bVar1 = psVar4[lVar6];
    if ((((0x3f < bVar1 - 0x21) ||
         ((0xe00000000000367dU >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)) && (bVar1 != 0x7c)) &&
       (((bVar1 != 0x7e && (9 < (byte)(bVar1 - 0x30))) &&
        (lVar3 = lVar6, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))) break;
  }
  (__return_storage_ptr__->token).m_size = lVar3;
  (__return_storage_ptr__->token).m_data = psVar4;
  (__return_storage_ptr__->tail).m_size = lVar5 - lVar3;
  (__return_storage_ptr__->tail).m_data = psVar4 + lVar3;
  return __return_storage_ptr__;
}

Assistant:

static constexpr auto parse_token(QByteArrayView data) noexcept
{
    struct R {
        QByteArrayView token, tail;
        constexpr explicit operator bool() const noexcept { return !token.isEmpty(); }
    };

    qsizetype i = 0;
    while (i < data.size() && is_tchar(data[i]))
        ++i;

    return R{data.first(i), data.sliced(i)};
}